

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::connectDestroyed(TcpConnection *this)

{
  __shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *in_RSI;
  __shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state == kConnected) {
    this->m_state = kDisconnected;
    Channel::disableAll((this->m_channel)._M_t.
                        super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                        .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl);
    in_RSI = local_30;
    std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::TcpConnection,void>
              (in_RSI,(__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator()
              (&this->m_connectionCallback,(shared_ptr<sznet::net::TcpConnection> *)in_RSI);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  Channel::remove((this->m_channel)._M_t.
                  super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                  .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl,(char *)in_RSI);
  return;
}

Assistant:

void TcpConnection::connectDestroyed()
{
	m_loop->assertInLoopThread();
	if (m_state == kConnected)
	{
		setState(kDisconnected);
		m_channel->disableAll();

		m_connectionCallback(shared_from_this());
	}
	m_channel->remove();
}